

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O2

int archive_read_format_rar_bid(archive_read *a,int best_bid)

{
  int iVar1;
  ssize_t in_RAX;
  int *__s1;
  void *pvVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  ssize_t bytes_avail;
  
  iVar1 = -1;
  if ((best_bid < 0x1f) &&
     (bytes_avail = in_RAX, __s1 = (int *)__archive_read_ahead(a,7,(ssize_t *)0x0),
     __s1 != (int *)0x0)) {
    iVar1 = bcmp(__s1,"Rar!\x1a\a",7);
    if (iVar1 == 0) {
      iVar1 = 0x1e;
    }
    else if ((((char)*__s1 == 'M') && (*(char *)((long)__s1 + 1) == 'Z')) ||
            (iVar1 = 0, *__s1 == 0x464c457f)) {
      lVar3 = 0x10000;
      uVar5 = 0x1000;
      do {
        while( true ) {
          if (0x20000 < (long)(uVar5 + lVar3)) goto LAB_0012a652;
          pvVar2 = __archive_read_ahead(a,uVar5 + lVar3,&bytes_avail);
          if (pvVar2 == (void *)0x0) break;
          uVar4 = bytes_avail + (long)pvVar2;
          for (; (ulong)((long)pvVar2 + lVar3 + 7) < uVar4; lVar3 = lVar3 + 0x10) {
            iVar1 = bcmp((void *)(lVar3 + (long)pvVar2),"Rar!\x1a\a",7);
            if (iVar1 == 0) {
              return 0x1e;
            }
          }
        }
        bVar6 = 0x7f < uVar5;
        uVar5 = uVar5 >> 1;
      } while (bVar6);
LAB_0012a652:
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int
archive_read_format_rar_bid(struct archive_read *a, int best_bid)
{
  const char *p;

  /* If there's already a bid > 30, we'll never win. */
  if (best_bid > 30)
	  return (-1);

  if ((p = __archive_read_ahead(a, 7, NULL)) == NULL)
    return (-1);

  if (memcmp(p, RAR_SIGNATURE, 7) == 0)
    return (30);

  if ((p[0] == 'M' && p[1] == 'Z') || memcmp(p, "\x7F\x45LF", 4) == 0) {
    /* This is a PE file */
    ssize_t offset = 0x10000;
    ssize_t window = 4096;
    ssize_t bytes_avail;
    while (offset + window <= (1024 * 128)) {
      const char *buff = __archive_read_ahead(a, offset + window, &bytes_avail);
      if (buff == NULL) {
        /* Remaining bytes are less than window. */
        window >>= 1;
        if (window < 0x40)
          return (0);
        continue;
      }
      p = buff + offset;
      while (p + 7 < buff + bytes_avail) {
        if (memcmp(p, RAR_SIGNATURE, 7) == 0)
          return (30);
        p += 0x10;
      }
      offset = p - buff;
    }
  }
  return (0);
}